

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu_x86.c
# Opt level: O1

void ShemuX86Multiply64Unsigned(SHEMU_VALUE *Operand1,SHEMU_VALUE *Operand2,SHEMU_VALUE *Result)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (Operand1->Value).Dwords[1];
  uVar2 = (Operand2->Value).Dwords[1];
  uVar5 = (ulong)(Operand2->Value).Dwords[0] * (ulong)(Operand1->Value).Dwords[0];
  uVar3 = (ulong)(Operand1->Value).Dwords[0] * (ulong)uVar2;
  uVar4 = (ulong)(Operand2->Value).Dwords[0] * (ulong)uVar1;
  (Result->Value).Qwords[0] = ((ulong)(uint)((int)uVar4 + (int)uVar3) << 0x20) + uVar5;
  (Result->Value).Qwords[1] =
       (uVar4 >> 0x20) + (uVar3 >> 0x20) + (ulong)uVar1 * (ulong)uVar2 +
       ((uVar4 & 0xffffffff) + (uVar3 & 0xffffffff) + (uVar5 >> 0x20) >> 0x20);
  return;
}

Assistant:

static void
ShemuX86Multiply64Unsigned(
    SHEMU_VALUE *Operand1,
    SHEMU_VALUE *Operand2,
    SHEMU_VALUE *Result
    )
{
    ND_UINT64 p0, p1, p2, p3, p4;

    // Multiply the 4 32-bit parts into 4 partial products.
    p0 = (ND_UINT64)Operand1->Value.Dwords[0] * (ND_UINT64)Operand2->Value.Dwords[0];
    p1 = (ND_UINT64)Operand1->Value.Dwords[0] * (ND_UINT64)Operand2->Value.Dwords[1];
    p2 = (ND_UINT64)Operand1->Value.Dwords[1] * (ND_UINT64)Operand2->Value.Dwords[0];
    p3 = (ND_UINT64)Operand1->Value.Dwords[1] * (ND_UINT64)Operand2->Value.Dwords[1];
    p4 = (((p0 >> 32) + (p1 & 0xFFFFFFFF) + (p2 & 0xFFFFFFFF)) >> 32) & 0xFFFFFFFF;

    // Fill in the final result (low & high 64-bit parts).
    Result->Value.Qwords[0] = p0 + (p1 << 32) + (p2 << 32);
    Result->Value.Qwords[1] = p3 + (p1 >> 32) + (p2 >> 32) + p4;
}